

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O1

vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_> *
wasm::StringifyProcessor::filterOverlaps
          (vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           *__return_storage_ptr__,
          vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
          *substrings)

{
  pointer *__args_1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this;
  pointer puVar1;
  iterator __position;
  long lVar2;
  pointer pvVar3;
  uint *__args;
  ulong uVar4;
  undefined1 auVar5 [8];
  size_type __n;
  pointer puVar6;
  int iVar7;
  ulong uVar8;
  pointer pRVar9;
  bool bVar10;
  undefined1 local_c0 [8];
  vector<int,_std::allocator<int>_> indices;
  uint startIdx;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  *result;
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  startIndices;
  vector<int,_std::allocator<int>_> substringIdxs;
  
  uVar4 = 0;
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result = (vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
            *)0x0;
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  startIndices.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pRVar9 = (substrings->
           super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((substrings->
      super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
      )._M_impl.super__Vector_impl_data._M_finish == pRVar9) {
    __n = 0;
  }
  else {
    __args_1 = &intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      puVar6 = pRVar9[uVar4].StartIndices.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = pRVar9[uVar4].StartIndices.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      iVar7 = (int)uVar4;
      if (puVar6 != puVar1) {
        do {
          indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._0_4_ = *puVar6;
          intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + pRVar9[uVar4].Length;
          std::vector<wasm::Interval,std::allocator<wasm::Interval>>::
          emplace_back<unsigned_int&,unsigned_int,unsigned_int_const&>
                    ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)&result,
                     (uint *)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(uint *)__args_1,
                     &pRVar9[uVar4].Length);
          intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = iVar7;
          if (substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start == (pointer)0x0) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       &startIndices.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(iterator)0x0,
                       (int *)__args_1);
          }
          else {
            *substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar7;
            substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 substringIdxs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
          puVar6 = puVar6 + 1;
        } while (puVar6 != puVar1);
      }
      uVar4 = (ulong)(iVar7 + 1);
      pRVar9 = (substrings->
               super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __n = (long)(substrings->
                  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 5;
    } while (uVar4 < __n);
  }
  (__return_storage_ptr__->
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage,__n,
           (allocator_type *)
           &indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage);
  IntervalProcessor::filterOverlaps
            ((vector<int,_std::allocator<int>_> *)local_c0,
             (vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)&result);
  for (auVar5 = local_c0;
      auVar5 != (undefined1  [8])
                indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; auVar5 = (undefined1  [8])((long)auVar5 + 4)) {
    __args = (uint *)((long)&(result->
                             super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                             )._M_impl.super__Vector_impl_data._M_start + (long)*(int *)auVar5 * 0xc
                     );
    this = (vector<unsigned_int,std::allocator<unsigned_int>> *)
           (CONCAT44(intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     (int)intervals.
                          super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) +
           (long)*(int *)((long)&((startIndices.
                                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_start + (long)*(int *)auVar5 * 4
                         ) * 0x18);
    __position._M_current = *(uint **)(this + 8);
    if (__position._M_current == *(uint **)(this + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (this,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      *(uint **)(this + 8) = __position._M_current + 1;
    }
  }
  pvVar3 = (pointer)CONCAT44(intervals.
                             super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             (int)intervals.
                                  super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (startIndices.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pvVar3) {
    uVar4 = 0;
    uVar8 = 1;
    do {
      if (4 < (ulong)((long)pvVar3[uVar4].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)pvVar3[uVar4].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start)) {
        pvVar3 = pvVar3 + uVar4;
        indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (substrings->
             super__Vector_base<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             )._M_impl.super__Vector_impl_data._M_start[uVar4].Length;
        puVar1 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar6 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
        ::emplace_back<wasm::SuffixTree::RepeatedSubstring>
                  (__return_storage_ptr__,
                   (RepeatedSubstring *)
                   &indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if (puVar1 != (pointer)0x0) {
          operator_delete(puVar1,(long)puVar6 - (long)puVar1);
        }
      }
      pvVar3 = (pointer)CONCAT44(intervals.
                                 super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 (int)intervals.
                                      super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar4 = ((long)startIndices.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)pvVar3 >> 3) *
              -0x5555555555555555;
      bVar10 = uVar8 <= uVar4;
      lVar2 = uVar4 - uVar8;
      uVar4 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar10 && lVar2 != 0);
  }
  if (local_c0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_c0,
                    (long)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_c0);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (startIndices.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(startIndices.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    -(long)startIndices.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (result != (vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                 *)0x0) {
    operator_delete(result,(long)intervals.
                                 super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)result);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SuffixTree::RepeatedSubstring> StringifyProcessor::filterOverlaps(
  const std::vector<SuffixTree::RepeatedSubstring>& substrings) {
  // A substring represents a contiguous set of instructions that appear more
  // than once in a Wasm binary. For each appearance of the substring, an
  // Interval is created that lacks a connection back to its originating
  // substring. To fix, upon Interval creation, a second vector is populated
  // with the index of the corresponding substring.
  std::vector<Interval> intervals;
  std::vector<int> substringIdxs;

  // Construct intervals
  for (Index i = 0; i < substrings.size(); i++) {
    auto& substring = substrings[i];
    for (auto startIdx : substring.StartIndices) {
      intervals.emplace_back(
        startIdx, startIdx + substring.Length, substring.Length);
      substringIdxs.push_back(i);
    }
  }

  // Get the overlapping intervals
  std::vector<SuffixTree::RepeatedSubstring> result;
  std::vector<std::vector<Index>> startIndices(substrings.size());
  std::vector<int> indices = IntervalProcessor::filterOverlaps(intervals);
  for (auto i : indices) {
    // i is the idx of the Interval in the intervals vector
    // i in substringIdxs returns the idx of the substring that needs to be
    // included in result
    auto substringIdx = substringIdxs[i];
    startIndices[substringIdx].push_back(intervals[i].start);
  }
  for (Index i = 0; i < startIndices.size(); i++) {
    if (startIndices[i].size() > 1) {
      result.emplace_back(SuffixTree::RepeatedSubstring(
        {substrings[i].Length, std::move(startIndices[i])}));
    }
  }

  return result;
}